

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void sort_constraints(TCGOpDef *def,int start,int n)

{
  int iVar1;
  int iVar2;
  int tmp;
  int p2;
  int p1;
  int j;
  int i;
  int n_local;
  int start_local;
  TCGOpDef *def_local;
  
  for (p1 = 0; p1 < n; p1 = p1 + 1) {
    def->sorted_args[start + p1] = start + p1;
  }
  if (1 < n) {
    for (p1 = 0; p2 = p1, p1 < n + -1; p1 = p1 + 1) {
      while (p2 = p2 + 1, p2 < n) {
        iVar1 = get_constraint_priority(def,def->sorted_args[start + p1]);
        iVar2 = get_constraint_priority(def,def->sorted_args[start + p2]);
        if (iVar1 < iVar2) {
          iVar1 = def->sorted_args[start + p1];
          def->sorted_args[start + p1] = def->sorted_args[start + p2];
          def->sorted_args[start + p2] = iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void sort_constraints(TCGOpDef *def, int start, int n)
{
    int i, j, p1, p2, tmp;

    for(i = 0; i < n; i++)
        def->sorted_args[start + i] = start + i;
    if (n <= 1)
        return;
    for(i = 0; i < n - 1; i++) {
        for(j = i + 1; j < n; j++) {
            p1 = get_constraint_priority(def, def->sorted_args[start + i]);
            p2 = get_constraint_priority(def, def->sorted_args[start + j]);
            if (p1 < p2) {
                tmp = def->sorted_args[start + i];
                def->sorted_args[start + i] = def->sorted_args[start + j];
                def->sorted_args[start + j] = tmp;
            }
        }
    }
}